

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<BreakStatementAstNode>_> * __thiscall
Parser::parseBreakStatement
          (optional<std::shared_ptr<BreakStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  undefined1 local_70 [16];
  shared_ptr<Token> breakToken;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined1 local_2a;
  char local_29;
  bool error;
  
  local_29 = '\0';
  breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = &local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,"Expected a break","");
  expect((Parser *)&stack0xffffffffffffffa0,(TokenType)this,(bool *)0xb,(string *)&local_29);
  if (breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      &local_40) {
    operator_delete(breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,(long)local_40._vptr__Sp_counted_base + 1);
  }
  skipWhiteSpace(this);
  breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = &local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,"Expected a semicolon after break","");
  expect((Parser *)local_70,(TokenType)this,(bool *)0x10,(string *)&local_29);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if (breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      &local_40) {
    operator_delete(breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,(long)local_40._vptr__Sp_counted_base + 1);
  }
  if (local_29 == '\x01') {
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BreakStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BreakStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_>._M_engaged = false;
  }
  else {
    breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<BreakStatementAstNode,std::allocator<BreakStatementAstNode>,std::shared_ptr<Token>&>
              (&local_48,
               (BreakStatementAstNode **)
               &breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (allocator<BreakStatementAstNode> *)&local_2a,
               (shared_ptr<Token> *)&stack0xffffffffffffffa0);
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BreakStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BreakStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<BreakStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BreakStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BreakStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<BreakStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_48._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<BreakStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<BreakStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<BreakStatementAstNode>_>._M_engaged = true;
  }
  if (breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<BreakStatementAstNode>>
Parser::parseBreakStatement() noexcept {
  bool error = false;

  auto breakToken = this->expect(TokenType::Break, error, "Expected a break");

  this->skipWhiteSpace();

  this->expect(TokenType::SemiColon, error, "Expected a semicolon after break");

  if (error) { return std::nullopt; }

  return std::make_shared<BreakStatementAstNode>(breakToken);
}